

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::next(Session *this,UtcTimeStamp *now)

{
  bool bVar1;
  int iVar2;
  IntField *this_00;
  bool local_262;
  IOException *e;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  UtcTimeStamp local_190;
  allocator<char> local_171;
  string local_170;
  UtcTimeStamp local_150;
  UtcTimeStamp local_138;
  allocator<char> local_119;
  string local_118;
  UtcTimeStamp local_f8;
  allocator<char> local_d9;
  string local_d8;
  byte local_b1;
  UtcTimeStamp local_b0;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_49;
  string local_48;
  UtcTimeStamp *local_18;
  UtcTimeStamp *now_local;
  Session *this_local;
  
  local_18 = now;
  now_local = (UtcTimeStamp *)this;
  bVar1 = checkSessionTime(this,now);
  if (bVar1) {
    bVar1 = isEnabled(this);
    if ((!bVar1) || (bVar1 = isLogonTime(this,local_18), !bVar1)) {
      bVar1 = isLoggedOn(this);
      if (!bVar1) {
        return;
      }
      bVar1 = SessionState::sentLogout(&this->m_state);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Initiated logout request",&local_49);
        SessionState::onEvent(&this->m_state,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::allocator<char>::~allocator(&local_49);
        SessionState::logoutReason_abi_cxx11_(&local_70,&this->m_state);
        generateLogout(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    bVar1 = SessionState::receivedLogon(&this->m_state);
    if (bVar1) {
      this_00 = &SessionState::heartBtInt(&this->m_state)->super_IntField;
      iVar2 = IntField::operator_cast_to_int(this_00);
      if (iVar2 != 0) {
        std::function<FIX::UtcTimeStamp_()>::operator()(&local_f8,&this->m_timestamper);
        bVar1 = SessionState::logoutTimedOut(&this->m_state,&local_f8);
        UtcTimeStamp::~UtcTimeStamp(&local_f8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"Timed out waiting for logout response",&local_119);
          SessionState::onEvent(&this->m_state,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          disconnect(this);
        }
        std::function<FIX::UtcTimeStamp_()>::operator()(&local_138,&this->m_timestamper);
        bVar1 = SessionState::withinHeartBeat(&this->m_state,&local_138);
        UtcTimeStamp::~UtcTimeStamp(&local_138);
        if (!bVar1) {
          std::function<FIX::UtcTimeStamp_()>::operator()(&local_150,&this->m_timestamper);
          bVar1 = SessionState::timedOut(&this->m_state,&local_150);
          UtcTimeStamp::~UtcTimeStamp(&local_150);
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_170,"Timed out waiting for heartbeat",&local_171);
            SessionState::onEvent(&this->m_state,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::allocator<char>::~allocator(&local_171);
            disconnect(this);
          }
          else {
            std::function<FIX::UtcTimeStamp_()>::operator()(&local_190,&this->m_timestamper);
            bVar1 = SessionState::needTestRequest(&this->m_state,&local_190);
            UtcTimeStamp::~UtcTimeStamp(&local_190);
            if (bVar1) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"TEST",&local_1b1);
              generateTestRequest(this,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator(&local_1b1);
              iVar2 = SessionState::testRequest(&this->m_state);
              SessionState::testRequest(&this->m_state,iVar2 + 1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d8,"Sent test request TEST",&local_1d9);
              SessionState::onEvent(&this->m_state,&local_1d8);
              std::__cxx11::string::~string((string *)&local_1d8);
              std::allocator<char>::~allocator(&local_1d9);
            }
            else {
              std::function<FIX::UtcTimeStamp_()>::operator()
                        ((UtcTimeStamp *)&e,&this->m_timestamper);
              bVar1 = SessionState::needHeartbeat(&this->m_state,(UtcTimeStamp *)&e);
              UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&e);
              if (bVar1) {
                generateHeartbeat(this);
              }
            }
          }
        }
      }
    }
    else {
      bVar1 = SessionState::shouldSendLogon(&this->m_state);
      if ((bVar1) && (bVar1 = isLogonTime(this,local_18), bVar1)) {
        generateLogon(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Initiated logon request",&local_91);
        SessionState::onEvent(&this->m_state,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      else {
        local_b1 = 0;
        bVar1 = SessionState::alreadySentLogon(&this->m_state);
        local_262 = false;
        if (bVar1) {
          std::function<FIX::UtcTimeStamp_()>::operator()(&local_b0,&this->m_timestamper);
          local_b1 = 1;
          local_262 = SessionState::logonTimedOut(&this->m_state,&local_b0);
        }
        if ((local_b1 & 1) != 0) {
          UtcTimeStamp::~UtcTimeStamp(&local_b0);
        }
        if (local_262 != false) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"Timed out waiting for logon response",&local_d9);
          SessionState::onEvent(&this->m_state,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          disconnect(this);
        }
      }
    }
  }
  else {
    reset(this);
  }
  return;
}

Assistant:

void Session::next(const UtcTimeStamp &now) {
  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    if (!isEnabled() || !isLogonTime(now)) {
      if (isLoggedOn()) {
        if (!m_state.sentLogout()) {
          m_state.onEvent("Initiated logout request");
          generateLogout(m_state.logoutReason());
        }
      } else {
        return;
      }
    }

    if (!m_state.receivedLogon()) {
      if (m_state.shouldSendLogon() && isLogonTime(now)) {
        generateLogon();
        m_state.onEvent("Initiated logon request");
      } else if (m_state.alreadySentLogon() && m_state.logonTimedOut(m_timestamper())) {
        m_state.onEvent("Timed out waiting for logon response");
        disconnect();
      }
      return;
    }

    if (m_state.heartBtInt() == 0) {
      return;
    }

    if (m_state.logoutTimedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for logout response");
      disconnect();
    }

    if (m_state.withinHeartBeat(m_timestamper())) {
      return;
    }

    if (m_state.timedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for heartbeat");
      disconnect();
    } else {
      if (m_state.needTestRequest(m_timestamper())) {
        generateTestRequest("TEST");
        m_state.testRequest(m_state.testRequest() + 1);
        m_state.onEvent("Sent test request TEST");
      } else if (m_state.needHeartbeat(m_timestamper())) {
        generateHeartbeat();
      }
    }
  } catch (FIX::IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }
}